

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O3

void __thiscall soplex::SSVectorBase<double>::reDim(SSVectorBase<double> *this,int newdim)

{
  int *piVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  
  lVar2 = (long)(this->super_IdxSet).num;
  if (0 < lVar2) {
    piVar1 = (this->super_IdxSet).idx;
    uVar3 = lVar2 + 1;
    do {
      if (newdim <= piVar1[uVar3 - 2]) {
        iVar4 = (this->super_IdxSet).num;
        (this->super_IdxSet).num = iVar4 + -1;
        piVar1[uVar3 - 2] = piVar1[(long)iVar4 + -1];
      }
      uVar3 = uVar3 - 1;
    } while (1 < uVar3);
  }
  VectorBase<double>::reDim(&this->super_VectorBase<double>,newdim,true);
  iVar4 = (int)((ulong)((long)(this->super_VectorBase<double>).val.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                       (long)(this->super_VectorBase<double>).val.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3) + 1;
  (this->super_IdxSet).len = iVar4;
  spx_realloc<int*>(&(this->super_IdxSet).idx,iVar4);
  return;
}

Assistant:

void reDim(int newdim)
   {
      for(int i = IdxSet::size() - 1; i >= 0; --i)
      {
         if(index(i) >= newdim)
            remove(i);
      }

      VectorBase<R>::reDim(newdim);
      setMax(VectorBase<R>::memSize() + 1);

      assert(isConsistent());
   }